

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix2 * matrix2_scalev2(matrix2 *self,vector2 *scale)

{
  anon_union_16_5_d0a4420b_for_matrix2_0 local_18;
  
  local_18._4_8_ = 0;
  local_18.m[0] = (scale->field_0).v[0];
  local_18.m[3] = (scale->field_0).v[1];
  matrix2_multiply(self,(matrix2 *)&local_18.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_scalev2(struct matrix2 *self, const struct vector2 *scale)
{
	struct matrix2 scalingMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_scalingv2(&scalingMatrix, scale));
}